

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O1

adt_error_t adt_bytearray_reserve(adt_bytearray_t *self,uint32_t u32NewLen)

{
  uint32_t uVar1;
  adt_error_t aVar2;
  uint32_t u32NewLen_00;
  
  if (self == (adt_bytearray_t *)0x0) {
    return '\x01';
  }
  if (self->u32AllocLen < u32NewLen) {
    uVar1 = self->u32GrowSize;
    u32NewLen_00 = u32NewLen;
    if (uVar1 != 0) {
      u32NewLen_00 = self->u32AllocLen - uVar1;
      do {
        u32NewLen_00 = u32NewLen_00 + uVar1;
      } while (u32NewLen_00 < u32NewLen);
    }
    aVar2 = adt_bytearray_realloc(self,u32NewLen_00);
    if (aVar2 != '\0') {
      return aVar2;
    }
  }
  return '\0';
}

Assistant:

adt_error_t adt_bytearray_reserve(adt_bytearray_t *self, uint32_t u32NewLen){
   if(self){
      if(u32NewLen > self->u32AllocLen){
         adt_error_t errorCode = adt_bytearray_grow(self,u32NewLen);
         if(errorCode != ADT_NO_ERROR){
            return errorCode;
         }
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}